

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

Maybe<unsigned_int> __thiscall kj::anon_unknown_0::tryFromHexDigit(anon_unknown_0 *this,char c)

{
  uint local_20;
  uint local_1c;
  uint local_18;
  char local_11;
  anon_unknown_0 *paStack_10;
  char c_local;
  
  local_11 = c;
  paStack_10 = this;
  if ((c < '0') || ('9' < c)) {
    if ((c < 'a') || ('f' < c)) {
      if ((c < 'A') || ('F' < c)) {
        Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(void *)0x0);
      }
      else {
        local_20 = (int)c - 0x37;
        Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,&local_20);
      }
    }
    else {
      local_1c = (int)c - 0x57;
      Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,&local_1c);
    }
  }
  else {
    local_18 = (int)c - 0x30;
    Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,&local_18);
  }
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

static Maybe<uint> tryFromHexDigit(char c) {
  if ('0' <= c && c <= '9') {
    return c - '0';
  } else if ('a' <= c && c <= 'f') {
    return c - ('a' - 10);
  } else if ('A' <= c && c <= 'F') {
    return c - ('A' - 10);
  } else {
    return nullptr;
  }
}